

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O3

void cali_begin_string_byname(char *attr_name,char *val)

{
  size_t size;
  Attribute attr;
  Caliper c;
  allocator<char> local_69;
  Attribute local_68;
  string local_60;
  Caliper local_40;
  
  cali::Caliper::Caliper(&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,attr_name,&local_69);
  local_68 = cali::Caliper::create_attribute
                       (&local_40,&local_60,CALI_TYPE_STRING,0,0,(Attribute *)0x0,(Variant *)0x0);
  if ((cali_variant_t *)local_60._M_dataplus._M_p != (cali_variant_t *)&local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  size = strlen(val);
  local_60._0_16_ = cali_make_variant(CALI_TYPE_STRING,val,size);
  cali::Caliper::begin(&local_40,&local_68,(Variant *)&local_60);
  return;
}

Assistant:

void cali_begin_string_byname(const char* attr_name, const char* val)
{
    Caliper   c;
    Attribute attr = c.create_attribute(attr_name, CALI_TYPE_STRING, CALI_ATTR_DEFAULT);

    c.begin(attr, Variant(CALI_TYPE_STRING, val, strlen(val)));
}